

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode sendrecv_dl(Curl_easy *data,SingleRequest *k,int *didwhat)

{
  int iVar1;
  bool bVar2;
  size_t local_78;
  ssize_t nread;
  size_t bytestoread;
  _Bool is_eos;
  long lStack_60;
  _Bool is_multiplex;
  curl_off_t total_received;
  size_t sStack_50;
  int maxloops;
  size_t xfer_blen;
  size_t blen;
  char *xfer_buf;
  char *buf;
  connectdata *pcStack_28;
  CURLcode result;
  connectdata *conn;
  int *didwhat_local;
  SingleRequest *k_local;
  Curl_easy *data_local;
  
  pcStack_28 = data->conn;
  buf._4_4_ = 0;
  total_received._4_4_ = 10;
  lStack_60 = 0;
  bytestoread._7_1_ = false;
  conn = (connectdata *)didwhat;
  didwhat_local = (int *)k;
  k_local = (SingleRequest *)data;
  buf._4_4_ = Curl_multi_xfer_buf_borrow(data,(char **)&blen,&stack0xffffffffffffffb0);
  if (buf._4_4_ == CURLE_OK) {
    do {
      if (bytestoread._7_1_ == false) {
        bytestoread._7_1_ = Curl_conn_is_multiplex(pcStack_28,0);
      }
      xfer_buf = (char *)blen;
      nread = sStack_50;
      if ((sStack_50 != 0) && (0 < (long)k_local[3].sendbuf_hds_len)) {
        if (lStack_60 != 0) goto LAB_00199417;
        if ((long)k_local[3].sendbuf_hds_len < (long)sStack_50) {
          nread = k_local[3].sendbuf_hds_len;
        }
      }
      local_78 = Curl_xfer_recv_resp((Curl_easy *)k_local,(char *)blen,nread,bytestoread._7_1_,
                                     (CURLcode *)((long)&buf + 4));
      if ((long)local_78 < 0) {
        if (buf._4_4_ != CURLE_AGAIN) break;
        buf._4_4_ = CURLE_OK;
        if ((((*(uint *)((long)&k_local[2].maxdownload + 1) >> 3 & 1) == 0) ||
            ((*(uint *)((long)&k_local[2].maxdownload + 1) >> 0x11 & 1) == 0)) ||
           ((*(uint *)((long)&k_local[2].maxdownload + 1) >> 0xd & 1) != 0)) goto LAB_00199417;
        local_78 = 0;
      }
      xfer_blen = local_78;
      *(uint *)&(conn->cpool_node)._list = *(uint *)&(conn->cpool_node)._list | 1;
      if (local_78 == 0) {
        buf._4_4_ = Curl_req_stop_send_recv((Curl_easy *)k_local);
        if (buf._4_4_ != CURLE_OK) break;
        if ((*(uint *)((long)didwhat_local + 0xd9) >> 4 & 1) != 0) goto LAB_00199417;
        buf._4_4_ = CURLE_OK;
      }
      lStack_60 = xfer_blen + lStack_60;
      buf._4_4_ = Curl_xfer_write_resp((Curl_easy *)k_local,xfer_buf,xfer_blen,local_78 == 0);
      if ((buf._4_4_ != CURLE_OK) || ((*(uint *)((long)&k_local[2].maxdownload + 1) >> 1 & 1) != 0))
      break;
      if (((bytestoread._7_1_ == false) &&
          ((*(uint *)((long)&k_local[2].maxdownload + 1) >> 3 & 1) != 0)) || (local_78 == 0)) {
        *(uint *)&k_local[1].reader_stack = *(uint *)&k_local[1].reader_stack & 0xfffffffe;
      }
      if ((((didwhat_local[0x14] & 0x10U) != 0) || ((didwhat_local[0x14] & 1U) == 0)) ||
         (iVar1 = total_received._4_4_ + -1, bVar2 = total_received._4_4_ == 0,
         total_received._4_4_ = iVar1, bVar2)) goto LAB_00199417;
    } while( true );
  }
LAB_001994e7:
  Curl_multi_xfer_buf_release((Curl_easy *)k_local,(char *)blen);
  return buf._4_4_;
LAB_00199417:
  if (((total_received._4_4_ < 1) || (iVar1 = data_pending((Curl_easy *)k_local), iVar1 != 0)) &&
     (*(undefined1 *)((long)&k_local[0x16].sendbuf.max_chunks + 3) = 1,
     (didwhat_local[0x14] & 0x2aU) == 2)) {
    *(byte *)((long)&k_local[0x16].sendbuf.max_chunks + 3) =
         *(byte *)((long)&k_local[0x16].sendbuf.max_chunks + 3) | 2;
  }
  if (((didwhat_local[0x14] & 3U) == 2) &&
     ((((ulong)pcStack_28->bits >> 5 & 1) != 0 || (bytestoread._7_1_ != false)))) {
    if ((k_local != (SingleRequest *)0x0) &&
       (((*(ulong *)((long)&k_local[0xc].writebytecount + 2) >> 0x1c & 1) != 0 &&
        ((k_local[0x15].p.file == (FILEPROTO *)0x0 || (0 < (k_local[0x15].p.telnet)->us[0])))))) {
      Curl_infof((Curl_easy *)k_local,"we are done reading and this is set to close, stop send");
    }
    Curl_req_abort_sending((Curl_easy *)k_local);
  }
  goto LAB_001994e7;
}

Assistant:

static CURLcode sendrecv_dl(struct Curl_easy *data,
                            struct SingleRequest *k,
                            int *didwhat)
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  char *buf, *xfer_buf;
  size_t blen, xfer_blen;
  int maxloops = 10;
  curl_off_t total_received = 0;
  bool is_multiplex = FALSE;

  result = Curl_multi_xfer_buf_borrow(data, &xfer_buf, &xfer_blen);
  if(result)
    goto out;

  /* This is where we loop until we have read everything there is to
     read or we get a CURLE_AGAIN */
  do {
    bool is_eos = FALSE;
    size_t bytestoread;
    ssize_t nread;

    if(!is_multiplex) {
      /* Multiplexed connection have inherent handling of EOF and we do not
       * have to carefully restrict the amount we try to read.
       * Multiplexed changes only in one direction. */
      is_multiplex = Curl_conn_is_multiplex(conn, FIRSTSOCKET);
    }

    buf = xfer_buf;
    bytestoread = xfer_blen;

    if(bytestoread && data->set.max_recv_speed > 0) {
      /* In case of speed limit on receiving: if this loop already got
       * data, break out. If not, limit the amount of bytes to receive.
       * The overall, timed, speed limiting is done in multi.c */
      if(total_received)
        break;
      if(data->set.max_recv_speed < (curl_off_t)bytestoread)
        bytestoread = (size_t)data->set.max_recv_speed;
    }

    nread = Curl_xfer_recv_resp(data, buf, bytestoread,
                                is_multiplex, &result);
    if(nread < 0) {
      if(CURLE_AGAIN != result)
        goto out; /* real error */
      result = CURLE_OK;
      if(data->req.download_done && data->req.no_body &&
         !data->req.resp_trailer) {
        DEBUGF(infof(data, "EAGAIN, download done, no trailer announced, "
               "not waiting for EOS"));
        nread = 0;
        /* continue as if we read the EOS */
      }
      else
        break; /* get out of loop */
    }

    /* We only get a 0-length read on EndOfStream */
    blen = (size_t)nread;
    is_eos = (blen == 0);
    *didwhat |= KEEP_RECV;

    if(!blen) {
      /* if we receive 0 or less here, either the data transfer is done or the
         server closed the connection and we bail out from this! */
      if(is_multiplex)
        DEBUGF(infof(data, "nread == 0, stream closed, bailing"));
      else
        DEBUGF(infof(data, "nread <= 0, server closed connection, bailing"));
      result = Curl_req_stop_send_recv(data);
      if(result)
        goto out;
      if(k->eos_written) /* already did write this to client, leave */
        break;
    }
    total_received += blen;

    result = Curl_xfer_write_resp(data, buf, blen, is_eos);
    if(result || data->req.done)
      goto out;

    /* if we are done, we stop receiving. On multiplexed connections,
     * we should read the EOS. Which may arrive as meta data after
     * the bytes. Not taking it in might lead to RST of streams. */
    if((!is_multiplex && data->req.download_done) || is_eos) {
      data->req.keepon &= ~KEEP_RECV;
    }
    /* if we are PAUSEd or stopped receiving, leave the loop */
    if((k->keepon & KEEP_RECV_PAUSE) || !(k->keepon & KEEP_RECV))
      break;

  } while(maxloops--);

  if((maxloops <= 0) || data_pending(data)) {
    /* did not read until EAGAIN or there is still pending data, mark as
       read-again-please */
    data->state.select_bits = CURL_CSELECT_IN;
    if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
      data->state.select_bits |= CURL_CSELECT_OUT;
  }

  if(((k->keepon & (KEEP_RECV|KEEP_SEND)) == KEEP_SEND) &&
     (conn->bits.close || is_multiplex)) {
    /* When we have read the entire thing and the close bit is set, the server
       may now close the connection. If there is now any kind of sending going
       on from our side, we need to stop that immediately. */
    infof(data, "we are done reading and this is set to close, stop send");
    Curl_req_abort_sending(data);
  }

out:
  Curl_multi_xfer_buf_release(data, xfer_buf);
  if(result)
    DEBUGF(infof(data, "sendrecv_dl() -> %d", result));
  return result;
}